

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O0

void __thiscall gulcalc::mode0(gulcalc *this)

{
  bool bVar1;
  size_type sVar2;
  int *rec_00;
  int iVar3;
  EVP_PKEY_CTX *in_RSI;
  ulong uVar4;
  int recsize;
  int *q;
  bool bSuccess;
  char *p;
  damagecdfrec *d;
  char *rec;
  int last_event_id;
  int max_recsize;
  size_t total_bins;
  gulcalc *this_local;
  
  init(this,in_RSI);
  sVar2 = std::vector<damagebindictionary,_std::allocator<damagebindictionary>_>::size
                    (this->damagebindictionary_vec_);
  rec._0_4_ = -1;
  uVar4 = (ulong)((int)(sVar2 << 3) + 0x10);
  if ((long)uVar4 < 0) {
    uVar4 = 0xffffffffffffffff;
  }
  rec_00 = (int *)operator_new__(uVar4);
  if ((this->benchmark_ & 1U) != 0) {
    outputbenchmark(this,0,true);
  }
  while (bVar1 = (*this->iGetrec_)((char *)rec_00,0xc), bVar1) {
    (*this->iGetrec_)((char *)(rec_00 + 3),4);
    iVar3 = rec_00[3] * 8;
    (*this->iGetrec_)((char *)(rec_00 + 4),iVar3);
    if (*rec_00 != (int)rec) {
      if (0 < (int)rec) {
        if ((this->benchmark_ & 1U) != 0) {
          outputbenchmark(this,(int)rec,false);
        }
        outputcoveragedata(this,(int)rec);
      }
      rec._0_4_ = *rec_00;
      if (this->rndopt_ == usecachedvector) {
        getRands::clearvec(this->rnd_);
      }
    }
    processrec(this,(char *)rec_00,iVar3 + 0x10);
  }
  if ((this->benchmark_ & 1U) != 0) {
    outputbenchmark(this,*rec_00,false);
  }
  outputcoveragedata(this,*rec_00);
  if (this->itemWriter_ != (_func_void_void_ptr_int_int *)0x0) {
    (*this->itemWriter_)(this->ibuf_,1,this->itembufoffset_);
  }
  if (this->lossWriter_ != (_func_void_void_ptr_int_int *)0x0) {
    (*this->lossWriter_)(this->ibuf_,1,this->itembufoffset_);
  }
  if (this->coverageWriter_ != (_func_void_void_ptr_int_int *)0x0) {
    (*this->coverageWriter_)(this->cbuf_,1,this->covbufoffset_);
  }
  if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
    (*this->correlatedWriter_)(this->corrbuf_,1,this->correlatedbufoffset_);
  }
  if (rec_00 != (int *)0x0) {
    operator_delete__(rec_00);
  }
  return;
}

Assistant:

void gulcalc::mode0()
{
	init();

	size_t total_bins = damagebindictionary_vec_->size();
	const int max_recsize = (int)(total_bins * sizeof(prob_mean)) + sizeof(damagecdfrec) + sizeof(int);
	int last_event_id = -1;

	char *rec = new char[max_recsize];
	// char rec[max_recsize]; -- not portable will not compile with Microsoft c++ 
	
	damagecdfrec *d = (damagecdfrec *)rec;

	if (benchmark_) outputbenchmark(0, true);

	for (;;)
	{
		char *p = rec;
		bool bSuccess = iGetrec_(p, sizeof(damagecdfrec));
		if (bSuccess == false) break;
		p = p + sizeof(damagecdfrec);
		bSuccess = iGetrec_(p, sizeof(int)); // we now have bin count
		int *q = (int *)p;
		p = p + sizeof(int);
		int recsize = (*q) * sizeof(prob_mean);
		// we should now have damagecdfrec in memory
		bSuccess = iGetrec_(p, recsize);
		recsize += sizeof(damagecdfrec) + sizeof(int);
		if (d->event_id != last_event_id) {
			if (last_event_id > 0) {
				if (benchmark_) outputbenchmark(last_event_id);
				outputcoveragedata(last_event_id);
			}
			last_event_id = d->event_id;						
			if (rndopt_ == rd_option::usecachedvector) rnd_->clearvec();
		}

		processrec(rec, recsize);
	}
	if (benchmark_) outputbenchmark(d->event_id);
	outputcoveragedata(d->event_id);
	if (itemWriter_)  itemWriter_(ibuf_, sizeof(unsigned char), itembufoffset_);
	if (lossWriter_)  lossWriter_(ibuf_, sizeof(unsigned char), itembufoffset_);
	if (coverageWriter_) coverageWriter_(cbuf_, sizeof(unsigned char), covbufoffset_);
	if (correlatedWriter_) correlatedWriter_(corrbuf_, sizeof(unsigned char), correlatedbufoffset_);

	delete[] rec;
}